

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

uint ReadMatchDistances(CLzmaEnc *p,uint *numPairsRes)

{
  UInt32 UVar1;
  UInt32 *pUVar2;
  ulong uVar3;
  Byte *pBVar4;
  bool bVar5;
  Byte *lim;
  ptrdiff_t dif;
  Byte *p2;
  Byte *p1;
  UInt32 numAvail;
  uint len;
  UInt32 *d;
  uint numPairs;
  uint *numPairsRes_local;
  CLzmaEnc *p_local;
  
  p->additionalOffset = p->additionalOffset + 1;
  UVar1 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
  p->numAvail = UVar1;
  pUVar2 = (*(p->matchFinder).GetMatches)(p->matchFinderObj,p->matches);
  uVar3 = (long)pUVar2 - (long)p->matches >> 2;
  *numPairsRes = (uint)uVar3;
  if ((uint)uVar3 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    p_local._4_4_ = p->matches[(uVar3 & 0xffffffff) - 2];
    if (p_local._4_4_ == p->numFastBytes) {
      p1._0_4_ = p->numAvail;
      if (0x111 < (uint)p1) {
        p1._0_4_ = 0x111;
      }
      pBVar4 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
      pBVar4 = pBVar4 + -1;
      dif = (ptrdiff_t)(pBVar4 + p_local._4_4_);
      while( true ) {
        bVar5 = false;
        if ((Byte *)dif != pBVar4 + (uint)p1) {
          bVar5 = *(char *)dif ==
                  *(char *)(dif + (-1 - (ulong)p->matches[(uVar3 & 0xffffffff) - 1]));
        }
        if (!bVar5) break;
        dif = dif + 1;
      }
      p_local._4_4_ = (int)dif - (int)pBVar4;
    }
  }
  return p_local._4_4_;
}

Assistant:

static unsigned ReadMatchDistances(CLzmaEnc *p, unsigned *numPairsRes)
{
  unsigned numPairs;
  
  p->additionalOffset++;
  p->numAvail = p->matchFinder.GetNumAvailableBytes(p->matchFinderObj);
  {
    const UInt32 *d = p->matchFinder.GetMatches(p->matchFinderObj, p->matches);
    // if (!d) { p->mf_Failure = True; *numPairsRes = 0;  return 0; }
    numPairs = (unsigned)(d - p->matches);
  }
  *numPairsRes = numPairs;
  
  #ifdef SHOW_STAT
  printf("\n i = %u numPairs = %u    ", g_STAT_OFFSET, numPairs / 2);
  g_STAT_OFFSET++;
  {
    unsigned i;
    for (i = 0; i < numPairs; i += 2)
      printf("%2u %6u   | ", p->matches[i], p->matches[i + 1]);
  }
  #endif
  
  if (numPairs == 0)
    return 0;
  {
    const unsigned len = p->matches[(size_t)numPairs - 2];
    if (len != p->numFastBytes)
      return len;
    {
      UInt32 numAvail = p->numAvail;
      if (numAvail > LZMA_MATCH_LEN_MAX)
        numAvail = LZMA_MATCH_LEN_MAX;
      {
        const Byte *p1 = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - 1;
        const Byte *p2 = p1 + len;
        const ptrdiff_t dif = (ptrdiff_t)-1 - (ptrdiff_t)p->matches[(size_t)numPairs - 1];
        const Byte *lim = p1 + numAvail;
        for (; p2 != lim && *p2 == p2[dif]; p2++)
        {}
        return (unsigned)(p2 - p1);
      }
    }
  }
}